

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenkoFPM.cpp
# Opt level: O3

void __thiscall
chrono::fea::BeamTaperedTimoshenkoFPM::Evaluate
          (BeamTaperedTimoshenkoFPM *this,ChMatrixNM<double,_12,_12> *result,double x)

{
  int iVar1;
  ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ChMatrixNM<double,_6,_6> Mlaw_point;
  ChMatrixNM<double,_6,_6> Rlaw_point;
  ChMatrixNM<double,_6,_6> Klaw_point;
  ChMatrixNM<double,_6,_12> Bx;
  ChMatrixNM<double,_6,_12> Nx;
  ShapeFunctionGroupFPM NxBx;
  Scalar local_11a0;
  Product<Eigen::Transpose<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
  local_1198;
  Matrix<double,_6,_12,_1,_6,_12> *local_1188;
  Matrix<double,_12,_12,_1,_12,_12> local_1180;
  Matrix<double,_6,_6,_1,_6,_6> local_ce0;
  Matrix<double,_6,_6,_1,_6,_6> local_bc0;
  Matrix<double,_6,_6,_1,_6,_6> local_aa0;
  Matrix<double,_6,_12,_1,_6,_12> local_980;
  Matrix<double,_6,_12,_1,_6,_12> local_740;
  ShapeFunctionGroupFPM local_500;
  
  ChElementBeamTaperedTimoshenkoFPM::ShapeFunctionsTimoshenkoFPM(this->m_element,&local_500,x);
  memcpy(&local_740,
         &local_500.
          super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>_>
          .super__Head_base<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_false>,0x240);
  memcpy(&local_980,&local_500,0x240);
  this_00 = (this->m_element->tapered_section_fpm).
            super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  this_01 = (this->m_element->tapered_section_fpm).
            super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  iVar1 = this->m_choice_KiRiMi;
  if (iVar1 == 0) {
    ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetKlawAtPoint
              ((ChMatrixNM<double,_6,_6> *)&local_1180,this_00,x);
    memcpy(&local_aa0,&local_1180,0x120);
    local_1198.m_lhs.m_matrix = &local_980;
    local_1198.m_rhs = &local_aa0;
    local_1188 = &local_980;
    memset(&local_1180,0,0x480);
    local_11a0 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,12,1,6,12>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,12,1,6,12>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,12,12,1,12,12>>
              (&local_1180,&local_1198,&local_980,&local_11a0);
  }
  else if (iVar1 == 1) {
    ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetRlawAtPoint
              ((ChMatrixNM<double,_6,_6> *)&local_1180,this_00,x);
    memcpy(&local_bc0,&local_1180,0x120);
    local_1198.m_lhs.m_matrix = &local_980;
    local_1198.m_rhs = &local_bc0;
    local_1188 = &local_980;
    memset(&local_1180,0,0x480);
    local_11a0 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,12,1,6,12>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,12,1,6,12>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,12,12,1,12,12>>
              (&local_1180,&local_1198,&local_980,&local_11a0);
  }
  else {
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Please input the correct option: 0,1,2",0x26);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      goto LAB_0067f570;
    }
    ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetMlawAtPoint
              ((ChMatrixNM<double,_6,_6> *)&local_1180,this_00,x);
    memcpy(&local_ce0,&local_1180,0x120);
    local_1198.m_lhs.m_matrix = &local_740;
    local_1198.m_rhs = &local_ce0;
    local_1188 = &local_740;
    memset(&local_1180,0,0x480);
    local_11a0 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,12,1,6,12>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,12,1,6,12>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,12,12,1,12,12>>
              (&local_1180,&local_1198,&local_740,&local_11a0);
  }
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[0];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [1] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[1];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [2] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[2];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [3] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[3];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [4] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[4];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [5] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[5];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [6] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[6];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [7] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[7];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [8] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[8];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [9] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[9];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [10] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
         m_data.array[10];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0xb] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[0xb];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0xc] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[0xc];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0xd] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[0xd];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0xe] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[0xe];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0xf] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[0xf];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x10] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x10];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x11] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x11];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x12] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x12];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x13] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x13];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x14] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x14];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x15] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x15];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x16] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x16];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x17] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x17];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x18] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x18];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x19] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x19];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x1a] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x1a];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x1b] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x1b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x1c] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x1c];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x1d] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x1d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x1e] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x1e];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x1f] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x1f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x20] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x20];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x21] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x21];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x22] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x22];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x23] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x23];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x24] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x24];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x25] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x25];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x26] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x26];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x27] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x27];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x28] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x28];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x29] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x29];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x2a] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x2a];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x2b] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x2b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x2c] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x2c];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x2d] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x2d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x2e] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x2e];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x2f] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x2f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x30] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x30];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x31] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x31];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x32] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x32];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x33] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x33];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x34] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x34];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x35] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x35];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x36] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x36];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x37] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x37];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x38] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x38];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x39] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x39];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x3a] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x3a];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x3b] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x3b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x3c] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x3c];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x3d] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x3d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x3e] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x3e];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x3f] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x3f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x40] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x40];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x41] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x41];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x42] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x42];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x43] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x43];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x44] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x44];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x45] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x45];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x46] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x46];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x47] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x47];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x48] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x48];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x49] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x49];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x4a] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x4a];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x4b] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x4b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x4c] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x4c];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x4d] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x4d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x4e] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x4e];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x4f] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x4f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x50] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x50];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x51] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x51];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x52] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x52];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x53] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x53];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x54] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x54];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x55] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x55];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x56] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x56];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x57] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x57];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x58] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x58];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x59] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x59];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x5a] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x5a];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x5b] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x5b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x5c] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x5c];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x5d] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x5d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x5e] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x5e];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x5f] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x5f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x60] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x60];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x61] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x61];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x62] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x62];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [99] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
         m_data.array[99];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [100] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[100];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x65] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x65];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x66] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x66];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x67] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x67];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x68] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x68];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x69] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x69];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x6a] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x6a];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x6b] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x6b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x6c] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x6c];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x6d] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x6d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x6e] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x6e];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x6f] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x6f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x70] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x70];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x71] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x71];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x72] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x72];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x73] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x73];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x74] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x74];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x75] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x75];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x76] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x76];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x77] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x77];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x78] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x78];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x79] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x79];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x7a] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x7a];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x7b] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x7b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x7c] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x7c];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x7d] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x7d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x7e] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x7e];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x7f] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x7f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x80] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x80];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x81] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x81];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x82] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x82];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x83] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x83];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x84] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x84];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x85] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x85];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x86] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x86];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x87] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x87];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x88] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x88];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x89] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x89];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x8a] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x8a];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x8b] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x8b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x8c] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x8c];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x8d] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x8d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x8e] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x8e];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
  [0x8f] = local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
           m_data.array[0x8f];
LAB_0067f570:
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void BeamTaperedTimoshenkoFPM::Evaluate(ChMatrixNM<double, 12, 12>& result, const double x) {
    double eta = x;

    ChElementBeamTaperedTimoshenkoFPM::ShapeFunctionGroupFPM NxBx;
    m_element->ShapeFunctionsTimoshenkoFPM(NxBx, eta);
    // shape function matrix
    ChMatrixNM<double, 6, 12> Nx = std::get<0>(NxBx);
    // strain-displacement relation matrix
    ChMatrixNM<double, 6, 12> Bx = std::get<1>(NxBx);

    auto tapered_section_fpm = m_element->GetTaperedSection();
    ChMatrixNM<double, 6, 6> Klaw_point;
    ChMatrixNM<double, 6, 6> Rlaw_point;
    ChMatrixNM<double, 6, 6> Mlaw_point;

    switch (m_choice_KiRiMi) {
        case 0:
            Klaw_point = tapered_section_fpm->GetKlawAtPoint(eta);
            result = Bx.transpose() * Klaw_point * Bx;
            break;
        case 1:
            Rlaw_point = tapered_section_fpm->GetRlawAtPoint(eta);
            result = Bx.transpose() * Rlaw_point * Bx;  // modified Rayleigh damping model
            break;
        case 2:
            Mlaw_point = tapered_section_fpm->GetMlawAtPoint(eta);
            result = Nx.transpose() * Mlaw_point * Nx;
            break;
        default:
            std::cout << "Please input the correct option: 0,1,2" << std::endl;
            return;
    }
}